

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::InsertSyncReset::inject_reset_logic
          (InsertSyncReset *this,SequentialStmtBlock *block,Port *port)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  StatementType SVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *this_00;
  StmtBlock *pSVar8;
  shared_ptr<kratos::ScopedStmtBlock> *psVar9;
  StmtBlock *pSVar10;
  uint64_t uVar11;
  element_type *peVar12;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var13;
  shared_ptr<kratos::Stmt> local_188;
  shared_ptr<kratos::Stmt> local_178;
  undefined1 local_168 [8];
  shared_ptr<kratos::ScopedStmtBlock> body;
  shared_ptr<kratos::IfStmt> sync_reset;
  undefined1 local_138 [8];
  shared_ptr<kratos::IfStmt> sync_reset_1;
  undefined1 local_118 [8];
  shared_ptr<kratos::ScopedStmtBlock> body_1;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  shared_ptr<kratos::IfStmt> if_2;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  shared_ptr<kratos::Var> target;
  shared_ptr<kratos::IfStmt> if_then;
  shared_ptr<kratos::Stmt> then_stmt;
  shared_ptr<kratos::ScopedStmtBlock> else_body;
  element_type *reset_stmt;
  IfStmt *local_68;
  shared_ptr<kratos::Var> *cond;
  undefined1 local_50 [8];
  shared_ptr<kratos::IfStmt> if_;
  undefined1 local_38 [8];
  shared_ptr<kratos::Stmt> stmt;
  uint64_t stmts_count;
  Port *port_local;
  SequentialStmtBlock *block_local;
  InsertSyncReset *this_local;
  
  stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)StmtBlock::size(&block->super_StmtBlock);
  if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
    return;
  }
  StmtBlock::get_stmt((StmtBlock *)local_38,(uint64_t)block);
  peVar5 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_38);
  SVar4 = Stmt::type(peVar5);
  if (SVar4 != If) {
    if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    goto LAB_003c1453;
  }
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38
            );
  Stmt::as<kratos::IfStmt>((Stmt *)local_50);
  std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_50);
  IfStmt::predicate((IfStmt *)&reset_stmt);
  local_68 = (IfStmt *)&reset_stmt;
  peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&reset_stmt);
  bVar2 = has_port_type(peVar6,AsyncReset);
  if (bVar2) {
    peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    bVar2 = has_port_type(peVar6,Reset);
    if (bVar2) goto LAB_003c0d90;
    peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    this_00 = &IfStmt::then_body(peVar7)->
               super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    pSVar8 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(this_00)->
              super_StmtBlock;
    peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    psVar9 = IfStmt::else_body(peVar7);
    std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
              ((shared_ptr<kratos::ScopedStmtBlock> *)
               &then_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               psVar9);
    pSVar10 = &std::
               __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&then_stmt.
                                super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount)->super_StmtBlock;
    uVar11 = StmtBlock::size(pSVar10);
    if (uVar11 == 1) {
      peVar12 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&then_stmt.
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      StmtBlock::get_stmt((StmtBlock *)
                          &if_then.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(uint64_t)peVar12);
      peVar5 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&if_then.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      SVar4 = Stmt::type(peVar5);
      if (SVar4 == If) {
        std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &if_then.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Stmt::as<kratos::IfStmt>
                  ((Stmt *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        IfStmt::predicate((IfStmt *)local_c0);
        peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
        bVar2 = has_port_type(peVar6,ClockEnable);
        if ((bVar2) && ((this->over_clk_en_ & 1U) == 0)) {
          peVar7 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          p_Var13 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)IfStmt::then_body(peVar7);
          pSVar10 = &std::
                     __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var13)->super_StmtBlock;
          bVar3 = StmtBlock::empty(pSVar10);
          if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = 0;
          bVar2 = false;
          if (!bVar3) {
            peVar7 = std::
                     __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&target.
                                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            p_Var13 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)IfStmt::then_body(peVar7);
            peVar12 = std::
                      __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var13);
            StmtBlock::get_stmt((StmtBlock *)local_d0,(uint64_t)peVar12);
            if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _7_1_ = 1;
            peVar5 = std::
                     __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0);
            SVar4 = Stmt::type(peVar5);
            bVar2 = SVar4 == If;
          }
          if ((if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               ._7_1_ & 1) != 0) {
            std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_d0);
          }
          if (bVar2) {
            peVar7 = std::
                     __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&target.
                                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            p_Var13 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)IfStmt::then_body(peVar7);
            peVar12 = std::
                      __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var13);
            StmtBlock::get_stmt((StmtBlock *)local_f8,(uint64_t)peVar12);
            std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
            Stmt::as<kratos::IfStmt>((Stmt *)local_e8);
            std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_f8);
            std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
            p_Var1 = &body_1.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount;
            IfStmt::predicate((IfStmt *)p_Var1);
            peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
            bVar2 = has_port_type(peVar6,Reset);
            std::shared_ptr<kratos::Var>::~shared_ptr
                      ((shared_ptr<kratos::Var> *)
                       &body_1.
                        super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _5_3_ = 0;
            if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_1_ = bVar2;
            std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_e8);
            if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                ._4_4_ != 0) goto LAB_003c12bc;
          }
          peVar7 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          p_Var13 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)IfStmt::then_body(peVar7);
          peVar12 = std::
                    __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var13);
          (*(peVar12->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])
                    (&sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_118);
          std::shared_ptr<kratos::Stmt>::~shared_ptr
                    ((shared_ptr<kratos::Stmt> *)
                     &sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          create_if_stmt_wrapper((kratos *)local_138,pSVar8,port,true);
          peVar7 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_138);
          IfStmt::set_else(peVar7,(shared_ptr<kratos::ScopedStmtBlock> *)local_118);
          peVar7 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          p_Var13 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)IfStmt::then_body(peVar7);
          peVar12 = std::
                    __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var13);
          (*(peVar12->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
          peVar7 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          p_Var1 = &sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                    ((shared_ptr<kratos::Stmt> *)p_Var1,(shared_ptr<kratos::IfStmt> *)local_138);
          IfStmt::add_then_stmt(peVar7,(shared_ptr<kratos::Stmt> *)p_Var1);
          std::shared_ptr<kratos::Stmt>::~shared_ptr
                    ((shared_ptr<kratos::Stmt> *)
                     &sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
               = 1;
          std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_138);
          std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                    ((shared_ptr<kratos::ScopedStmtBlock> *)local_118);
        }
        else {
          peVar6 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
          bVar2 = has_port_type(peVar6,Reset);
          if (bVar2) {
            if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 1;
          }
          else {
            if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 0;
          }
        }
LAB_003c12bc:
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_c0);
        std::shared_ptr<kratos::IfStmt>::~shared_ptr
                  ((shared_ptr<kratos::IfStmt> *)
                   &target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ == 0) goto LAB_003c12f9;
      }
      else {
LAB_003c12f9:
        if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             0;
      }
      std::shared_ptr<kratos::Stmt>::~shared_ptr
                ((shared_ptr<kratos::Stmt> *)
                 &if_then.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
          == 0) goto LAB_003c132c;
    }
    else {
LAB_003c132c:
      create_if_stmt_wrapper
                ((kratos *)
                 &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pSVar8,port,true);
      peVar12 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&then_stmt.
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      (*(peVar12->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])(&local_178);
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &local_178);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_168);
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_178);
      peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&body.
                              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      IfStmt::set_else(peVar7,(shared_ptr<kratos::ScopedStmtBlock> *)local_168);
      peVar12 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&then_stmt.
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      (*(peVar12->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
      pSVar8 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&then_stmt.
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount)->super_StmtBlock;
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                (&local_188,
                 (shared_ptr<kratos::IfStmt> *)
                 &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      StmtBlock::add_stmt(pSVar8,&local_188);
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_188);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_168);
      std::shared_ptr<kratos::IfStmt>::~shared_ptr
                ((shared_ptr<kratos::IfStmt> *)
                 &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0
      ;
    }
    std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::ScopedStmtBlock> *)
               &then_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
LAB_003c0d90:
    if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  }
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&reset_stmt);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_50);
LAB_003c1453:
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_38);
  return;
}

Assistant:

void inject_reset_logic(SequentialStmtBlock* block, Port* port) const {
        // only inject when there is a async reset logic
        auto stmts_count = block->size();
        if (stmts_count != 1) return;
        auto stmt = block->get_stmt(0);
        if (stmt->type() != StatementType::If) return;
        auto if_ = stmt->as<IfStmt>();
        auto const& cond = if_->predicate();
        // if it doesn't have async reset logic, or it already has sync reset logic
        // quit
        if (!has_port_type(cond.get(), PortType::AsyncReset) ||
            has_port_type(cond.get(), PortType::Reset))
            return;
        auto* reset_stmt = if_->then_body().get();
        // okay we have reset now. now we need to detect if it has clock enable
        // logic or not
        // we need to detect the clock enable logic and make sure that the ordering is what
        // specified in the
        auto else_body = if_->else_body();
        // detect if clock enable have been in place
        if (else_body->size() == 1) {
            auto then_stmt = else_body->get_stmt(0);
            if (then_stmt->type() == StatementType::If) {
                auto if_then = then_stmt->as<IfStmt>();
                auto target = if_then->predicate();
                if (has_port_type(target.get(), PortType::ClockEnable) && !over_clk_en_) {
                    // could be the case that it already has a reset
                    if (!if_then->then_body()->empty() &&
                        if_then->then_body()->get_stmt(0)->type() == StatementType::If) {
                        auto if_2 = if_then->then_body()->get_stmt(0)->as<IfStmt>();
                        // user already put it there
                        if (has_port_type(if_2->predicate().get(), PortType::Reset)) return;
                    }
                    // insert inside the clock enable body
                    auto body = if_then->then_body()->clone()->as<ScopedStmtBlock>();
                    // need to duplicate the logic in reset
                    auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
                    sync_reset->set_else(body);
                    if_then->then_body()->clear();
                    if_then->add_then_stmt(sync_reset);
                    return;
                } else if (has_port_type(target.get(), PortType::Reset)) {
                    // already has a sync reset
                    return;
                }
            }
        }
        auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
        auto body = else_body->clone()->as<ScopedStmtBlock>();
        sync_reset->set_else(body);
        else_body->clear();
        else_body->add_stmt(sync_reset);
    }